

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::addName(Builder *this,Id id,char *string)

{
  Instruction *this_00;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40 [3];
  Instruction *local_28;
  Instruction *name;
  char *string_local;
  Builder *pBStack_10;
  Id id_local;
  Builder *this_local;
  
  name = (Instruction *)string;
  string_local._4_4_ = id;
  pBStack_10 = this;
  this_00 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,id));
  Instruction::Instruction(this_00,OpName);
  local_28 = this_00;
  Instruction::addIdOperand(this_00,string_local._4_4_);
  Instruction::addStringOperand(local_28,(char *)name);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_40,local_28
            );
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->names,(value_type *)local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_40);
  return;
}

Assistant:

void Builder::addName(Id id, const char* string)
{
    Instruction* name = new Instruction(OpName);
    name->addIdOperand(id);
    name->addStringOperand(string);

    names.push_back(std::unique_ptr<Instruction>(name));
}